

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O3

void pbrt::syntactic::Attributes::push(SP *current)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  Attributes *pAVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined1 local_19;
  Attributes *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  if ((current->super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      == (element_type *)0x0) {
    local_18 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pbrt::syntactic::Attributes,std::allocator<pbrt::syntactic::Attributes>>
              (&_Stack_10,&local_18,(allocator<pbrt::syntactic::Attributes> *)&local_19);
  }
  else {
    local_18 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pbrt::syntactic::Attributes,std::allocator<pbrt::syntactic::Attributes>,std::shared_ptr<pbrt::syntactic::Attributes>&>
              (&_Stack_10,&local_18,(allocator<pbrt::syntactic::Attributes> *)&local_19,current);
  }
  _Var2._M_pi = _Stack_10._M_pi;
  pAVar1 = local_18;
  local_18 = (Attributes *)0x0;
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this = (current->super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
  (current->super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       pAVar1;
  (current->super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
  ._M_pi = _Var2._M_pi;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    if (_Stack_10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_10._M_pi);
    }
  }
  return;
}

Assistant:

static void push(Attributes::SP &current) {
        // Attributes::SP newGraphicsState = std::make_shared<Attributes>();
        // newGraphicsState->areaLightSources = graphicsState->areaLightSources;
        // newGraphicsState->mediumInterface = graphicsState->mediumInterface;
        // newGraphicsState->reverseOrientation = graphicsState->reverseOrientation;
        // newGraphicsState->parent = graphicsState;
        // graphicsState = newGraphicsState;
        current 
          = current.get()
          ? std::make_shared<Attributes>(current)
          : std::make_shared<Attributes>();
      }